

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<TestFunction>,testing::Matcher<int>>,std::tuple<TestFunction,int>>
               (tuple<testing::Matcher<TestFunction>,_testing::Matcher<int>_> *matcher_tuple,
               tuple<TestFunction,_int> *value_tuple)

{
  MatcherInterface<TestFunction> *pMVar1;
  MatcherInterface<int> *pMVar2;
  undefined1 uVar3;
  int iVar4;
  
  pMVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>).
           super__Head_base<0UL,_testing::Matcher<TestFunction>,_false>._M_head_impl.
           super_MatcherBase<TestFunction>.impl_.value_;
  iVar4 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,(ulong)(value_tuple->super__Tuple_impl<0UL,_TestFunction,_int>).
                                   super__Head_base<0UL,_TestFunction,_false>._M_head_impl.id_);
  if ((char)iVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    pMVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>).
             super__Tuple_impl<1UL,_testing::Matcher<int>_>.
             super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>
             .impl_.value_;
    iVar4 = (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar2,(ulong)(uint)(value_tuple->super__Tuple_impl<0UL,_TestFunction,_int>).
                                           super__Tuple_impl<1UL,_int>.
                                           super__Head_base<1UL,_int,_false>._M_head_impl);
    uVar3 = (undefined1)iVar4;
  }
  return (bool)uVar3;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }